

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void error<char>(char *fmtstr,char *args)

{
  allocator local_51;
  String local_50;
  undefined1 *local_30 [2];
  undefined1 local_20 [16];
  
  std::__cxx11::string::string((string *)local_30,fmtstr,&local_51);
  format<char>(&local_50,(String *)local_30,args);
  error(&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._string._M_dataplus._M_p != &local_50._string.field_2) {
    operator_delete(local_50._string._M_dataplus._M_p);
  }
  if (local_30[0] != local_20) {
    operator_delete(local_30[0]);
  }
  return;
}

Assistant:

void error (const char* fmtstr, const argtypes&... args)
{
	error (format (String (fmtstr), args...));
}